

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::div_by_2e32(char *ext,uint32_t *remp)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int16_t tmp;
  int iVar9;
  byte bVar10;
  ulong uVar11;
  uint32_t uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  iVar9 = (int)*(short *)(ext + 2);
  if (*(short *)(ext + 2) < 1) {
    *remp = 0;
    ext[2] = '\x01';
    ext[3] = '\0';
    ext[4] = ext[4] & 0xf0U | 8;
    memset(ext + 5,0,(ulong)(*(ushort *)ext + 1 >> 1));
    return;
  }
  uVar1 = *(ushort *)ext;
  uVar8 = (ulong)uVar1;
  if (uVar8 == 0) {
    uVar12 = 0;
    uVar6 = 0;
  }
  else {
    bVar10 = 0;
    uVar15 = 0;
    uVar6 = 0;
    bVar3 = false;
    uVar11 = 0;
    do {
      if (uVar15 < uVar8) {
        uVar13 = (ulong)((uint)(int)ext[(uVar15 >> 1) + 5] >> (~bVar10 & 4) & 0xf);
      }
      else {
        uVar13 = 0;
      }
      uVar14 = uVar13 + uVar11 * 10;
      lVar7 = (uVar11 >> 0x1d) + (uVar11 >> 0x1f) +
              (ulong)(((int)uVar11 * 8 ^ 0xffffffffU) < (uint)((int)uVar11 * 2)) +
              (ulong)((uVar11 * 10 & 0xffffffff ^ 0xffffffff) < uVar13);
      uVar12 = (uint32_t)uVar14;
      uVar11 = uVar14 & 0xffffffff;
      if (lVar7 != 0) {
        bVar3 = true;
      }
      if (bVar3) {
        bVar4 = ((byte)uVar6 & 1) << 2;
        uVar13 = uVar6 + 1;
        ext[(uVar6 >> 1) + 5] =
             '\x0f' << bVar4 & ext[(uVar6 >> 1) + 5] | ((byte)lVar7 & 0xf) << (bVar4 ^ 4);
        uVar6 = uVar13;
        if (iVar9 == (int)uVar13) {
          bVar2 = false;
        }
        else {
LAB_0023daa4:
          bVar2 = uVar11 != 0 || uVar15 < uVar8;
          if ((uVar11 == 0 && uVar15 >= uVar8) && (!bVar3)) {
            ext[2] = '\x01';
            ext[3] = '\0';
            ext[4] = ext[4] & 0xf0U | 8;
            bVar2 = false;
            memset(ext + 5,0,(ulong)(uVar1 + 1 >> 1));
            uVar6 = uVar8;
          }
        }
      }
      else {
        iVar9 = iVar9 + -1;
        *(short *)(ext + 2) = (short)iVar9;
        if (iVar9 != 0) goto LAB_0023daa4;
        iVar9 = 0;
        bVar2 = false;
      }
      if (!bVar2) break;
      uVar15 = uVar15 + 1;
      bVar10 = bVar10 + 4;
    } while (uVar6 < uVar8);
  }
  if (uVar6 < uVar8) {
    uVar5 = (int)uVar6 * 4;
    do {
      ext[(uVar6 >> 1) + 5] = ext[(uVar6 >> 1) + 5] & '\x0f' << ((byte)uVar5 & 4);
      uVar6 = uVar6 + 1;
      uVar5 = (uint)(byte)((byte)uVar5 + 4);
    } while (uVar8 != uVar6);
  }
  normalize(ext);
  *remp = uVar12;
  return;
}

Assistant:

void CVmObjBigNum::div_by_2e32(char *ext, uint32_t *remp)
{
    size_t in_idx;
    size_t out_idx;
    int sig;
    size_t prec = get_prec(ext);
    unsigned long rem = 0;
    int exp = get_exp(ext);

    /* if it's entirely fractional, the result is 0 with remainder 0 */
    if (exp <= 0)
    {
        *remp = 0;
        set_zero(ext);
        return;
    }

    /* start at the most significant digit and work down */
    for (rem = 0, sig = FALSE, in_idx = out_idx = 0 ;
         out_idx < prec ; ++in_idx)
    {
        /* 
         *   Multiply the remainder by 10.  10 == (2+8), so this is the sum
         *   of rem<<1 and rem<<3.  This is handy because it makes it
         *   relatively easy to calculate the overflow from the 32-bit
         *   accumulator on 32-bit platforms: the overflow is the sum of the
         *   high bit and the high three bits, plus the carry from the low
         *   part.  The low part has a carry of 1 if rem<<1 + rem<<3 exceeds
         *   0xffffffff, which we can calculate in 32 bits as rem<<1 >
         *   0xffffffff - rem<<3.  
         */
        ulong rem1 = (rem << 1) & 0xffffffff;
        ulong rem3 = (rem << 3) & 0xffffffff;
        ulong hi = ((rem >> 31) & 0x00000001)
                   + ((rem >> 29) & 0x00000007)
                   + (rem1 > 0xffffffff - rem3 ? 1 : 0);
        rem = (rem1 + rem3) & 0xffffffff;

        /* 
         *   Add the current digit into the remainder.  We again need to
         *   carry the overflow into the high part. 
         */
        ulong dig = (in_idx < prec ? get_dig(ext, in_idx) : 0);
        hi += dig > 0xffffffff - rem ? 1 : 0;
        rem = (rem + dig) & 0xffffffff;

        /*
         *   We now have the quotient of rem/2^32 in 'hi', and the remainder
         *   in 'rem'.
         */
        int quo = (int)hi;

        /* if the quotient is non-zero, we've found a significant digit */
        if (quo != 0)
            sig = TRUE;

        /* 
         *   if we've found a significant digit, store it; otherwise, just
         *   reduce the exponent to account for an implied leading zero that
         *   we won't actually store 
         */
        if (sig)
        {
            /* store the digit */
            set_dig(ext, out_idx++, quo);

            /* 
             *   if we've reached the decimal place, stop here, since we're
             *   doing integer division 
             */
            if ((int)out_idx == exp)
                break;
        }
        else
        {
            /* all leading zeros so far - adjust the exponent */
            set_exp(ext, --exp);

            /* if this leaves us with a fractional result, we're done */
            if (exp == 0)
                break;
        }

        /* 
         *   If we've reached the last input digit and the remainder is zero,
         *   we're done - fill out the rest of the number with trailing zeros
         *   and stop looping.  If we've reached the decimal point in the
         *   output, stop here, since we're doing an integer division.  
         */
        if (rem == 0 && in_idx >= prec)
        {
            /* if we don't have any significant digits, we have a zero */
            if (!sig)
            {
                set_zero(ext);
                out_idx = prec;
            }

            /* we have our result */
            break;
        }
    }

    /* fill out the rest of the number with zeros */
    for ( ; out_idx < prec ; ++out_idx)
        set_dig(ext, out_idx, 0);

    /* normalize the result */
    normalize(ext);

    /* pass back the remainder */
    *remp = rem;
}